

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmq.c
# Opt level: O1

int nni_lmq_get(nni_lmq *lmq,nng_msg **mp)

{
  ulong uVar1;
  size_t sVar2;
  nng_msg *pnVar3;
  
  if (lmq->lmq_len != 0) {
    sVar2 = lmq->lmq_get;
    uVar1 = sVar2 + 1;
    lmq->lmq_get = uVar1;
    pnVar3 = lmq->lmq_msgs[sVar2];
    lmq->lmq_get = uVar1 & lmq->lmq_mask;
    lmq->lmq_len = lmq->lmq_len - 1;
    *mp = pnVar3;
    return 0;
  }
  return 8;
}

Assistant:

int
nni_lmq_get(nni_lmq *lmq, nng_msg **mp)
{
	nng_msg *msg;
	if (lmq->lmq_len == 0) {
		return (NNG_EAGAIN);
	}
	msg = lmq->lmq_msgs[lmq->lmq_get++];
	lmq->lmq_get &= lmq->lmq_mask;
	lmq->lmq_len--;
	*mp = msg;
	return (0);
}